

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::RenderLineStrip<ImPlot::GetterXsYs<long_long>,ImPlot::TransformerLinLin>
               (GetterXsYs<long_long> *getter,TransformerLinLin *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  float *pfVar1;
  float fVar2;
  ImPlotPlot *pIVar3;
  ImPlotContext *pIVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  ImPlotContext *gp;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_70;
  float local_64;
  TransformerLinLin *local_60;
  undefined1 local_58 [8];
  TransformerLinLin *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar4 = GImPlot;
  pIVar3 = GImPlot->CurrentPlot;
  if (((pIVar3->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar6 = getter->Count;
    local_48 = iVar6 + -1;
    lVar5 = (long)((getter->Offset % iVar6 + iVar6) % iVar6) * (long)getter->Stride;
    iVar6 = transformer->YAxis;
    local_3c.x = (float)(((double)*(long *)((long)getter->Xs + lVar5) - (pIVar3->XAxis).Range.Min) *
                         GImPlot->Mx + (double)GImPlot->PixelRange[iVar6].Min.x);
    local_3c.y = (float)(((double)*(long *)((long)getter->Ys + lVar5) -
                         pIVar3->YAxis[iVar6].Range.Min) * GImPlot->My[iVar6] +
                        (double)GImPlot->PixelRange[iVar6].Min.y);
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    local_40 = line_weight;
    RenderPrimitives<ImPlot::LineStripRenderer<ImPlot::GetterXsYs<long_long>,ImPlot::TransformerLinLin>>
              ((LineStripRenderer<ImPlot::GetterXsYs<long_long>,_ImPlot::TransformerLinLin> *)
               local_58,DrawList,&pIVar3->PlotRect);
  }
  else {
    iVar6 = getter->Count;
    lVar5 = (long)((getter->Offset % iVar6 + iVar6) % iVar6) * (long)getter->Stride;
    iVar6 = transformer->YAxis;
    local_58._0_4_ =
         (undefined4)
         (((double)*(long *)((long)getter->Xs + lVar5) - (pIVar3->XAxis).Range.Min) * GImPlot->Mx +
         (double)GImPlot->PixelRange[iVar6].Min.x);
    local_58._4_4_ =
         (undefined4)
         (((double)*(long *)((long)getter->Ys + lVar5) - pIVar3->YAxis[iVar6].Range.Min) *
          GImPlot->My[iVar6] + (double)GImPlot->PixelRange[iVar6].Min.y);
    iVar6 = getter->Count;
    if (1 < iVar6) {
      iVar7 = 1;
      local_64 = line_weight;
      local_60 = transformer;
      do {
        lVar5 = (long)(((getter->Offset + iVar7) % iVar6 + iVar6) % iVar6) * (long)getter->Stride;
        iVar6 = transformer->YAxis;
        local_70.x = (float)(((double)*(long *)((long)getter->Xs + lVar5) -
                             (GImPlot->CurrentPlot->XAxis).Range.Min) * GImPlot->Mx +
                            (double)GImPlot->PixelRange[iVar6].Min.x);
        local_70.y = (float)(((double)*(long *)((long)getter->Ys + lVar5) -
                             GImPlot->CurrentPlot->YAxis[iVar6].Range.Min) * GImPlot->My[iVar6] +
                            (double)GImPlot->PixelRange[iVar6].Min.y);
        pIVar3 = pIVar4->CurrentPlot;
        fVar2 = (float)local_58._4_4_;
        if (local_70.y <= (float)local_58._4_4_) {
          fVar2 = local_70.y;
        }
        if ((fVar2 < (pIVar3->PlotRect).Max.y) &&
           (fVar2 = (float)(~-(uint)(local_70.y <= (float)local_58._4_4_) & (uint)local_70.y |
                           local_58._4_4_ & -(uint)(local_70.y <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar3->PlotRect).Min.y, *pfVar1 <= fVar2 && fVar2 != *pfVar1)) {
          fVar2 = (float)local_58._0_4_;
          if (local_70.x <= (float)local_58._0_4_) {
            fVar2 = local_70.x;
          }
          if ((fVar2 < (pIVar3->PlotRect).Max.x) &&
             (fVar2 = (float)(~-(uint)(local_70.x <= (float)local_58._0_4_) & (uint)local_70.x |
                             local_58._0_4_ & -(uint)(local_70.x <= (float)local_58._0_4_)),
             (pIVar3->PlotRect).Min.x <= fVar2 && fVar2 != (pIVar3->PlotRect).Min.x)) {
            ImDrawList::AddLine(DrawList,(ImVec2 *)local_58,&local_70,col,line_weight);
            transformer = local_60;
            line_weight = local_64;
          }
        }
        local_58._0_4_ = local_70.x;
        local_58._4_4_ = local_70.y;
        iVar7 = iVar7 + 1;
        iVar6 = getter->Count;
      } while (iVar7 < iVar6);
    }
  }
  return;
}

Assistant:

inline void RenderLineStrip(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(LineStripRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}